

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  int iVar2;
  ImGuiContext *g;
  int iVar3;
  int iVar4;
  int iVar5;
  bool *pbVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    pbVar6 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar6 = &pIVar1->SkipItems;
    }
    if (*pbVar6 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar9 = (pIVar1->ClipRect).Min.y;
    fVar10 = (pIVar1->ClipRect).Max.y;
    fVar8 = fVar10;
    if (GImGui->NavMoveScoringItems == true) {
      fVar11 = (GImGui->NavScoringNoClipRect).Min.y;
      fVar8 = (GImGui->NavScoringNoClipRect).Max.y;
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
      if (fVar8 <= fVar10) {
        fVar8 = fVar10;
      }
    }
    fVar10 = fVar8;
    if ((GImGui->NavJustMovedToId != 0) && (pIVar1->NavLastIds[0] == GImGui->NavJustMovedToId)) {
      fVar10 = (pIVar1->DC).CursorStartPos.y;
      fVar11 = pIVar1->NavRectRel[0].Min.y + fVar10;
      fVar10 = fVar10 + pIVar1->NavRectRel[0].Max.y;
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
      if (fVar10 <= fVar8) {
        fVar10 = fVar8;
      }
    }
    fVar8 = (pIVar1->DC).CursorPos.y;
    if ((GImGui->NavMoveScoringItems == false) || (GImGui->NavWindow == (ImGuiWindow *)0x0)) {
      bVar7 = false;
    }
    else {
      bVar7 = GImGui->NavWindow->RootWindowForNav == pIVar1->RootWindowForNav;
    }
    iVar3 = (int)((fVar9 - fVar8) / items_height);
    if (bVar7) {
      iVar3 = iVar3 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar5 = (int)((fVar10 - fVar8) / items_height);
    if (bVar7) {
      iVar5 = iVar5 + (uint)(GImGui->NavMoveClipDir == 3);
    }
    iVar2 = items_count;
    if (iVar3 < items_count) {
      iVar2 = iVar3;
    }
    iVar4 = 0;
    if (-1 < iVar3) {
      iVar4 = iVar2;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 < items_count) {
      items_count = iVar5;
    }
    if (iVar5 < iVar4) {
      items_count = iVar4;
    }
    *out_items_display_start = iVar4;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    // We don't include g.NavId's rectangle in there (unless g.NavJustMovedToId is set) because the rectangle enlargement can get costly.
    ImRect rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        rect.Add(g.NavScoringNoClipRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        rect.Add(WindowRectRelToAbs(window, window->NavRectRel[0])); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((rect.Min.y - pos.y) / items_height);
    int end = (int)((rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    // FIXME: Verify this works with tabbing
    const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}